

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWSLoader.cpp
# Opt level: O1

void __thiscall
Assimp::LWSImporter::InternReadFile
          (LWSImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  byte *pbVar1;
  list<Assimp::LWS::NodeDesc_*,_std::allocator<Assimp::LWS::NodeDesc_*>_> *plVar2;
  Assimp AVar3;
  double dVar4;
  pointer __src;
  pointer ppaVar5;
  PropertyMap *pPVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  undefined4 extraout_var;
  long lVar11;
  _List_node_base *p_Var12;
  Logger *pLVar13;
  _Node *p_Var14;
  _List_node_base *p_Var15;
  aiScene *this_00;
  aiNode *this_01;
  aiCamera **ppaVar16;
  aiLight **ppaVar17;
  aiNode **ppaVar18;
  aiNode *this_02;
  aiAnimation **ppaVar19;
  aiAnimation *paVar20;
  aiNodeAnim **__dest;
  long *plVar21;
  runtime_error *prVar22;
  char cVar23;
  uint uVar24;
  undefined1 *puVar25;
  PropertyMap *pPVar26;
  size_type *psVar27;
  byte bVar28;
  byte bVar29;
  uint uVar30;
  _List_node_base *p_Var31;
  char *pcVar32;
  undefined7 uVar34;
  LWSImporter *pLVar33;
  ulong in_R8;
  ulong __n;
  LWSImporter *dad;
  ulong uVar35;
  FlipWindingOrderProcess flipper;
  list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_> nodes;
  uint local_2ac;
  NodeDesc d;
  uint local_1dc;
  BatchLoader batch;
  const_iterator it;
  vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_> anims;
  aiCamera **cams;
  aiScene *pScene_local;
  int local_194;
  PropertyMap *local_190;
  PropertyMap *local_188;
  aiLight **lights;
  MakeLeftHandedProcess monster_cheat;
  vector<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_> attach;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  long local_130;
  uint local_128;
  char *local_120;
  _List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_> local_118;
  undefined1 auStack_100 [16];
  undefined1 local_f0 [16];
  undefined8 local_e0;
  undefined8 local_d8;
  _List_node_base local_d0 [2];
  PropertyMap *local_b0;
  vector<char,_std::allocator<char>_> mBuffer;
  char *dummy;
  Element root;
  IOStream *stream;
  
  this->io = pIOHandler;
  psVar27 = &d.path._M_string_length;
  d._0_8_ = psVar27;
  pScene_local = pScene;
  std::__cxx11::string::_M_construct<char_const*>((string *)&d,"rb","");
  iVar7 = (*pIOHandler->_vptr_IOSystem[4])(pIOHandler,(pFile->_M_dataplus)._M_p,d._0_8_);
  stream = (IOStream *)CONCAT44(extraout_var,iVar7);
  if ((size_type *)d._0_8_ != psVar27) {
    operator_delete((void *)d._0_8_);
  }
  if (stream == (IOStream *)0x0) {
    prVar22 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&attach,
                   "Failed to open LWS file ",pFile);
    plVar21 = (long *)std::__cxx11::string::append((char *)&attach);
    d._0_8_ = *plVar21;
    psVar27 = (size_type *)(plVar21 + 2);
    if ((size_type *)d._0_8_ == psVar27) {
      d.path._M_string_length = *psVar27;
      d.path.field_2._M_allocated_capacity = plVar21[3];
      d._0_8_ = &d.path._M_string_length;
    }
    else {
      d.path._M_string_length = *psVar27;
    }
    d.path._M_dataplus._M_p = (pointer)plVar21[1];
    *plVar21 = (long)psVar27;
    plVar21[1] = 0;
    *(undefined1 *)(plVar21 + 2) = 0;
    std::runtime_error::runtime_error(prVar22,(string *)&d);
    *(undefined ***)prVar22 = &PTR__runtime_error_00896c98;
    __cxa_throw(prVar22,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  mBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  mBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  mBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  BaseImporter::TextFileToBuffer(stream,&mBuffer,FORBID_EMPTY);
  lVar11 = 0x10;
  do {
    puVar25 = (undefined1 *)((long)&root.tokens[0]._M_dataplus._M_p + lVar11);
    *(undefined1 **)
     ((long)&mBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
             ._M_end_of_storage + lVar11) = puVar25;
    *(undefined8 *)((long)root.tokens + lVar11 + -8) = 0;
    *puVar25 = 0;
    lVar11 = lVar11 + 0x20;
  } while (lVar11 != 0x50);
  root.children.super__List_base<Assimp::LWS::Element,_std::allocator<Assimp::LWS::Element>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&root.children;
  root.children.super__List_base<Assimp::LWS::Element,_std::allocator<Assimp::LWS::Element>_>.
  _M_impl._M_node._M_size = 0;
  dummy = mBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start;
  root.children.super__List_base<Assimp::LWS::Element,_std::allocator<Assimp::LWS::Element>_>.
  _M_impl._M_node.super__List_node_base._M_prev =
       root.children.super__List_base<Assimp::LWS::Element,_std::allocator<Assimp::LWS::Element>_>.
       _M_impl._M_node.super__List_node_base._M_next;
  LWS::Element::Parse(&root,&dummy);
  BatchLoader::BatchLoader(&batch,pIOHandler,false);
  p_Var12 = root.children.
            super__List_base<Assimp::LWS::Element,_std::allocator<Assimp::LWS::Element>_>._M_impl.
            _M_node.super__List_node_base._M_next;
  nodes.super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>._M_impl.
  _M_node._M_size = 0;
  it._M_node = root.children.
               super__List_base<Assimp::LWS::Element,_std::allocator<Assimp::LWS::Element>_>._M_impl
               ._M_node.super__List_node_base._M_next;
  p_Var31 = root.children.
            super__List_base<Assimp::LWS::Element,_std::allocator<Assimp::LWS::Element>_>._M_impl.
            _M_node.super__List_node_base._M_next + 1;
  nodes.super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)&nodes;
  nodes.super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)&nodes;
  iVar7 = std::__cxx11::string::compare((char *)p_Var31);
  iVar8 = std::__cxx11::string::compare((char *)p_Var31);
  if ((iVar7 != 0) && (iVar8 != 0)) {
    prVar22 = (runtime_error *)__cxa_allocate_exception(0x10);
    d._0_8_ = psVar27;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&d,"LWS: Not a LightWave scene, magic tag LWSC not found","");
    std::runtime_error::runtime_error(prVar22,(string *)&d);
    *(undefined ***)prVar22 = &PTR__runtime_error_00896c98;
    __cxa_throw(prVar22,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  p_Var31 = p_Var12->_M_next;
  p_Var12 = p_Var31[1]._M_next;
  cVar23 = *(char *)&p_Var12->_M_next;
  uVar30 = 0;
  if (0xf5 < (byte)(cVar23 - 0x3aU)) {
    uVar30 = 0;
    do {
      p_Var12 = (_List_node_base *)((long)&p_Var12->_M_next + 1);
      uVar30 = (uint)(byte)(cVar23 - 0x30) + uVar30 * 10;
      cVar23 = *(char *)&p_Var12->_M_next;
    } while (0xf5 < (byte)(cVar23 - 0x3aU));
  }
  it._M_node = p_Var31;
  pLVar13 = DefaultLogger::get();
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&d,
                 "LWS file format version is ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var31 + 1))
  ;
  Logger::info(pLVar13,(char *)d._0_8_);
  if ((size_type *)d._0_8_ != psVar27) {
    operator_delete((void *)d._0_8_);
  }
  this->first = 0.0;
  this->last = 60.0;
  this->fps = 25.0;
  if (it._M_node == (_List_node_base *)&root.children) {
    local_2ac = 0;
    local_1dc = 0;
    p_Var12 = nodes.super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>.
              _M_impl._M_node.super__List_node_base._M_next;
    p_Var31 = nodes.super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>.
              _M_impl._M_node.super__List_node_base._M_next;
joined_r0x0044d6be:
    for (; nodes.super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>.
           _M_impl._M_node.super__List_node_base._M_next = p_Var31,
        p_Var12 != (_List_node_base *)&nodes; p_Var12 = p_Var12->_M_next) {
      if (p_Var31 != (_List_node_base *)&nodes) {
        do {
          if ((((p_Var31 != p_Var12) && (uVar30 = *(uint *)&p_Var31[4]._M_next, uVar30 != 0)) &&
              (uVar30 >> 0x1c == *(uint *)&p_Var12[1]._M_next)) &&
             ((uVar30 & 0xfffffff) == *(uint *)((long)&p_Var12[3]._M_prev + 4))) {
            if (p_Var31[0xb]._M_next == (_List_node_base *)0x0) {
              p_Var15 = (_List_node_base *)operator_new(0x18);
              p_Var15[1]._M_next = p_Var31 + 1;
              std::__detail::_List_node_base::_M_hook(p_Var15);
              p_Var12[10]._M_prev = (_List_node_base *)((long)&(p_Var12[10]._M_prev)->_M_next + 1);
              p_Var31[0xb]._M_next = p_Var12 + 1;
            }
            else {
              pLVar13 = DefaultLogger::get();
              Logger::error(pLVar13,"LWS: Found cross reference in scene-graph");
            }
          }
          p_Var31 = p_Var31->_M_next;
        } while (p_Var31 != (_List_node_base *)&nodes);
      }
      p_Var31 = nodes.
                super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>.
                _M_impl._M_node.super__List_node_base._M_next;
    }
    uVar30 = 0;
    for (; p_Var31 != (_List_node_base *)&nodes; p_Var31 = p_Var31->_M_next) {
      uVar30 = uVar30 + (p_Var31[0xb]._M_next == (_List_node_base *)0x0);
    }
    if (uVar30 == 0) {
      prVar22 = (runtime_error *)__cxa_allocate_exception(0x10);
      d._0_8_ = &d.path._M_string_length;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&d,"LWS: Unable to find scene root node","");
      std::runtime_error::runtime_error(prVar22,(string *)&d);
      *(undefined ***)prVar22 = &PTR__runtime_error_00896c98;
      __cxa_throw(prVar22,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    BatchLoader::LoadAll(&batch);
    this_00 = (aiScene *)operator_new(0x80);
    aiScene::aiScene(this_00);
    this_01 = (aiNode *)operator_new(0x478);
    aiNode::aiNode(this_01);
    this_00->mRootNode = this_01;
    if (local_2ac != 0) {
      this_00->mNumCameras = local_2ac;
      ppaVar16 = (aiCamera **)operator_new__((ulong)local_2ac << 3);
      this_00->mCameras = ppaVar16;
    }
    cams = this_00->mCameras;
    if (local_1dc != 0) {
      this_00->mNumLights = local_1dc;
      ppaVar17 = (aiLight **)operator_new__((ulong)local_1dc << 3);
      this_00->mLights = ppaVar17;
    }
    lights = this_00->mLights;
    attach.super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    attach.super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    attach.super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    anims.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    anims.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    anims.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (this_01->mName).length = 9;
    builtin_strncpy((this_01->mName).data,"<LWSRoot>",10);
    ppaVar18 = (aiNode **)operator_new__((ulong)uVar30 << 3);
    this_01->mChildren = ppaVar18;
    if (nodes.super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>.
        _M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&nodes) {
      p_Var31 = nodes.
                super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>.
                _M_impl._M_node.super__List_node_base._M_next;
      do {
        if (p_Var31[0xb]._M_next == (_List_node_base *)0x0) {
          this_02 = (aiNode *)operator_new(0x478);
          aiNode::aiNode(this_02);
          uVar30 = this_01->mNumChildren;
          this_01->mNumChildren = uVar30 + 1;
          this_01->mChildren[uVar30] = this_02;
          this_02->mParent = this_01;
          BuildGraph(this,this_02,(NodeDesc *)(p_Var31 + 1),&attach,&batch,&cams,&lights,&anims);
        }
        p_Var31 = p_Var31->_M_next;
      } while (p_Var31 != (_List_node_base *)&nodes);
    }
    ppaVar5 = anims.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    __src = anims.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>._M_impl.
            super__Vector_impl_data._M_start;
    uVar35 = (long)anims.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)anims.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
    __n = (long)anims.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)anims.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    if (__n != 0) {
      this_00->mNumAnimations = 1;
      ppaVar19 = (aiAnimation **)operator_new__(8);
      this_00->mAnimations = ppaVar19;
      paVar20 = (aiAnimation *)operator_new(0x448);
      (paVar20->mName).length = 0;
      (paVar20->mName).data[0] = '\0';
      memset((paVar20->mName).data + 1,0x1b,0x3ff);
      paVar20->mDuration = -1.0;
      paVar20->mTicksPerSecond = 0.0;
      paVar20->mNumChannels = 0;
      paVar20->mChannels = (aiNodeAnim **)0x0;
      paVar20->mNumMeshChannels = 0;
      paVar20->mMeshChannels = (aiMeshAnim **)0x0;
      paVar20->mNumMorphMeshChannels = 0;
      paVar20->mMorphMeshChannels = (aiMeshMorphAnim **)0x0;
      *ppaVar19 = paVar20;
      (paVar20->mName).length = 0xd;
      builtin_strncpy((paVar20->mName).data,"LWSMasterAnim",0xe);
      paVar20->mTicksPerSecond = this->fps;
      paVar20->mDuration = this->last - (this->first + -1.0);
      paVar20->mNumChannels = (uint)(uVar35 >> 3);
      __dest = (aiNodeAnim **)operator_new__(__n & 0x7fffffff8);
      paVar20->mChannels = __dest;
      if (ppaVar5 != __src) {
        memmove(__dest,__src,__n);
      }
    }
    MakeLeftHandedProcess::MakeLeftHandedProcess(&monster_cheat);
    MakeLeftHandedProcess::Execute(&monster_cheat,this_00);
    FlipWindingOrderProcess::FlipWindingOrderProcess(&flipper);
    FlipWindingOrderProcess::Execute(&flipper,this_00);
    uVar30 = 0x13;
    if (this->configSpeedFlag != false) {
      uVar30 = 1;
    }
    SceneCombiner::MergeScenes(&pScene_local,this_00,&attach,uVar30);
    if (((pScene_local->mNumMeshes == 0) || (pScene_local->mNumMaterials == 0)) &&
       ((*(byte *)&pScene_local->mFlags = (byte)pScene_local->mFlags | 1,
        pScene_local->mNumAnimations != 0 && (this->noSkeletonMesh == false)))) {
      SkeletonMeshBuilder::SkeletonMeshBuilder
                ((SkeletonMeshBuilder *)&d,pScene_local,(aiNode *)0x0,false);
      if (d._48_8_ != 0) {
        operator_delete((void *)d._48_8_);
      }
      if (d.path.field_2._M_allocated_capacity != 0) {
        operator_delete((void *)d.path.field_2._M_allocated_capacity);
      }
      if (d._0_8_ != 0) {
        operator_delete((void *)d._0_8_);
      }
    }
    FlipWindingOrderProcess::~FlipWindingOrderProcess(&flipper);
    MakeLeftHandedProcess::~MakeLeftHandedProcess(&monster_cheat);
    if (anims.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(anims.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (attach.super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(attach.
                      super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    std::__cxx11::_List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>::
    _M_clear(&nodes.super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>)
    ;
    BatchLoader::~BatchLoader(&batch);
    std::__cxx11::_List_base<Assimp::LWS::Element,_std::allocator<Assimp::LWS::Element>_>::_M_clear
              (&root.children.
                super__List_base<Assimp::LWS::Element,_std::allocator<Assimp::LWS::Element>_>);
    lVar11 = 0;
    do {
      pcVar32 = *(char **)((long)&root.tokens[1]._M_dataplus._M_p + lVar11);
      if (root.tokens[1].field_2._M_local_buf + lVar11 != pcVar32) {
        operator_delete(pcVar32);
      }
      lVar11 = lVar11 + -0x20;
    } while (lVar11 != -0x40);
    if (mBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(mBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    (*stream->_vptr_IOStream[1])();
    return;
  }
  plVar2 = &d.children;
  pPVar26 = (PropertyMap *)(local_d0 + 1);
  local_190 = (PropertyMap *)0x0;
  local_188 = (PropertyMap *)0x0;
  uVar9 = 0;
  local_1dc = 0;
  local_2ac = 0;
  local_194 = iVar7;
  local_b0 = pPVar26;
LAB_0044c1a0:
  flipper.super_BaseProcess._vptr_BaseProcess = (_func_int **)it._M_node[3]._M_next;
  dad = (LWSImporter *)(it._M_node + 1);
  iVar7 = std::__cxx11::string::compare((char *)dad);
  if (iVar7 != 0) {
    iVar7 = std::__cxx11::string::compare((char *)dad);
    if (iVar7 == 0) {
      if ((this->last != 150392.0) || (NAN(this->last))) {
        pPVar26 = (PropertyMap *)(ulong)*(byte *)flipper.super_BaseProcess._vptr_BaseProcess;
        if ((byte)(*(byte *)flipper.super_BaseProcess._vptr_BaseProcess - 0x3a) < 0xf6) {
          dVar4 = -1.0;
        }
        else {
          uVar10 = 0;
          do {
            uVar10 = (uint)(byte)((char)pPVar26 - 0x30) + uVar10 * 10;
            pbVar1 = (byte *)((long)flipper.super_BaseProcess._vptr_BaseProcess + 1);
            pPVar26 = (PropertyMap *)(ulong)*pbVar1;
            flipper.super_BaseProcess._vptr_BaseProcess =
                 (_func_int **)((long)flipper.super_BaseProcess._vptr_BaseProcess + 1);
          } while (0xf5 < (byte)(*pbVar1 - 0x3a));
          pPVar26 = (PropertyMap *)(ulong)uVar10;
          dVar4 = (double)(long)pPVar26 + -1.0;
        }
        this->last = dVar4;
      }
      goto LAB_0044cd57;
    }
    iVar7 = std::__cxx11::string::compare((char *)dad);
    if (iVar7 == 0) {
      pPVar26 = (PropertyMap *)(ulong)*(byte *)flipper.super_BaseProcess._vptr_BaseProcess;
      dVar4 = 0.0;
      if (0xf5 < (byte)(*(byte *)flipper.super_BaseProcess._vptr_BaseProcess - 0x3a)) {
        uVar10 = 0;
        do {
          uVar10 = (uint)(byte)((char)pPVar26 - 0x30) + uVar10 * 10;
          pbVar1 = (byte *)((long)flipper.super_BaseProcess._vptr_BaseProcess + 1);
          pPVar26 = (PropertyMap *)(ulong)*pbVar1;
          flipper.super_BaseProcess._vptr_BaseProcess =
               (_func_int **)((long)flipper.super_BaseProcess._vptr_BaseProcess + 1);
        } while (0xf5 < (byte)(*pbVar1 - 0x3a));
        pPVar26 = (PropertyMap *)(ulong)uVar10;
        dVar4 = (double)(long)pPVar26;
      }
      this->fps = dVar4;
      goto LAB_0044cd57;
    }
    iVar7 = std::__cxx11::string::compare((char *)dad);
    if (iVar7 == 0) {
      cVar23 = *(char *)flipper.super_BaseProcess._vptr_BaseProcess;
      iVar7 = 0;
      if (0xf5 < (byte)(cVar23 - 0x3aU)) {
        iVar7 = 0;
        do {
          iVar7 = (uint)(byte)(cVar23 - 0x30) + iVar7 * 10;
          cVar23 = *(char *)((long)flipper.super_BaseProcess._vptr_BaseProcess + 1);
          flipper.super_BaseProcess._vptr_BaseProcess =
               (_func_int **)((long)flipper.super_BaseProcess._vptr_BaseProcess + 1);
        } while (0xf5 < (byte)(cVar23 - 0x3aU));
      }
      pPVar26 = (PropertyMap *)&d;
      cams = (aiCamera **)CONCAT44(cams._4_4_,iVar7);
      d.path._M_dataplus._M_p = d.path._M_dataplus._M_p & 0xffffffff00000000;
      d.path._M_string_length = 0;
      d.path.field_2._M_allocated_capacity = (size_type)&d.path;
      d.id = 0;
      d.number = 0;
      d.name = (char *)((ulong)d.name & 0xffffffff00000000);
      d.channels.super__List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>.
      _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
      d.channels.super__List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>.
      _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&d.name;
      d.pivotPos._0_5_ = 0;
      d.pivotPos.y._1_3_ = 0;
      d.lightColor._0_8_ = d.lightColor._0_8_ & 0xffffffff00000000;
      d.lightColor.b = 0.0;
      d.lightIntensity = 0.0;
      d._120_8_ = &d.lightColor;
      d.children.super__List_base<Assimp::LWS::NodeDesc_*,_std::allocator<Assimp::LWS::NodeDesc_*>_>
      ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
      d.children.super__List_base<Assimp::LWS::NodeDesc_*,_std::allocator<Assimp::LWS::NodeDesc_*>_>
      ._M_impl._M_node._M_size._0_4_ = 0;
      d.parent_resolved = (NodeDesc *)0x0;
      d.path.field_2._8_8_ = d.path.field_2._M_allocated_capacity;
      d.channels.super__List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>.
      _M_impl._M_node._M_size =
           (size_t)d.channels.
                   super__List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>.
                   _M_impl._M_node.super__List_node_base._M_prev;
      d._128_8_ = d._120_8_;
      SetGenericProperty<int>
                ((map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
                  *)pPVar26,"IMPORT_LWO_ONE_LAYER_ONLY",(int *)&cams);
      pPVar6 = local_b0;
      attach.super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)&local_140;
      attach.super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_140._M_local_buf[0] = '\0';
      local_128 = 0;
      local_120 = "";
      local_118._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_118;
      auStack_100._8_4_ = 0.0;
      auStack_100[0xc] = false;
      local_118._M_impl._M_node._M_size = 0;
      auStack_100._0_5_ = 0;
      auStack_100._5_3_ = 0;
      local_f0._0_8_ = 0x3f8000003f800000;
      local_f0._8_8_ = 0x3f8000003f800000;
      local_e0._0_4_ = 0;
      local_e0._4_4_ = 0;
      local_d8._0_4_ = 45.0;
      local_d8._4_4_ = 0.0;
      local_d0[0]._M_next = local_d0;
      *(undefined8 *)&(local_b0->ints)._M_t._M_impl = 0;
      *(pointer *)&(pPVar6->ints)._M_t._M_impl.super__Rb_tree_header._M_header = (pointer)0x0;
      attach.super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44((int)((ulong)attach.
                                          super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 0x20),1);
      if (3 < uVar30) {
        for (; (*(char *)flipper.super_BaseProcess._vptr_BaseProcess == ' ' ||
               (*(char *)flipper.super_BaseProcess._vptr_BaseProcess == '\t'));
            flipper.super_BaseProcess._vptr_BaseProcess =
                 (_func_int **)((long)flipper.super_BaseProcess._vptr_BaseProcess + 1)) {
        }
        uVar10 = 0;
        do {
          cVar23 = *(char *)flipper.super_BaseProcess._vptr_BaseProcess;
          if ((byte)(cVar23 - 0x30U) < 10) {
            uVar10 = uVar10 << 4 | (uint)(byte)(cVar23 - 0x30U);
          }
          else {
            bVar28 = cVar23 + 0xbf;
            if ((5 < bVar28) && (bVar28 = cVar23 + 0x9f, 5 < bVar28)) goto LAB_0044c924;
            uVar10 = uVar10 * 0x10 + (uint)bVar28 + 10;
          }
          flipper.super_BaseProcess._vptr_BaseProcess =
               (_func_int **)((long)flipper.super_BaseProcess._vptr_BaseProcess + 1);
        } while( true );
      }
      uVar10 = uVar9 + 1;
      uVar24 = uVar9;
      goto LAB_0044c92f;
    }
    iVar7 = std::__cxx11::string::compare((char *)dad);
    uVar10 = uVar9;
    if (iVar7 == 0) {
      d.path._M_dataplus._M_p = (pointer)&d.path.field_2;
      d.path._M_string_length = 0;
      d.path.field_2._M_allocated_capacity =
           d.path.field_2._M_allocated_capacity & 0xffffffffffffff00;
      d._48_8_ = d._48_8_ & 0xffffffff00000000;
      d.name = "";
      d.channels.super__List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>.
      _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&d.channels;
      d.pivotPos.z = 0.0;
      d.isPivotSet = false;
      d.channels.super__List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>.
      _M_impl._M_node._M_size = 0;
      d.pivotPos._0_5_ = 0;
      d.pivotPos.y._1_3_ = 0;
      d.lightColor.r = 1.0;
      d.lightColor.g = 1.0;
      d.lightColor.b = 1.0;
      d.lightIntensity = 1.0;
      d.lightType = 0;
      d.lightFalloffType = 0;
      d.lightConeAngle = 45.0;
      d.lightEdgeAngle = 0.0;
      d.children.super__List_base<Assimp::LWS::NodeDesc_*,_std::allocator<Assimp::LWS::NodeDesc_*>_>
      ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&d.children;
      d.children.super__List_base<Assimp::LWS::NodeDesc_*,_std::allocator<Assimp::LWS::NodeDesc_*>_>
      ._M_impl._M_node._M_size._0_4_ = 0;
      d.parent_resolved = (NodeDesc *)0x0;
      d._4_4_ = d._4_4_;
      d.type = OBJECT;
      if (3 < uVar30) {
        uVar9 = 0;
        do {
          cVar23 = *(char *)flipper.super_BaseProcess._vptr_BaseProcess;
          if ((byte)(cVar23 - 0x30U) < 10) {
            uVar9 = uVar9 << 4 | (uint)(byte)(cVar23 - 0x30U);
          }
          else {
            bVar28 = cVar23 + 0xbf;
            if ((5 < bVar28) && (bVar28 = cVar23 + 0x9f, 5 < bVar28)) goto LAB_0044cba0;
            uVar9 = uVar9 * 0x10 + (uint)bVar28 + 10;
          }
          flipper.super_BaseProcess._vptr_BaseProcess =
               (_func_int **)((long)flipper.super_BaseProcess._vptr_BaseProcess + 1);
        } while( true );
      }
      uVar10 = uVar9 + 1;
      goto LAB_0044cbc9;
    }
    iVar7 = std::__cxx11::string::compare((char *)dad);
    if (iVar7 != 0) {
      iVar7 = std::__cxx11::string::compare((char *)dad);
      if (iVar7 != 0) {
        iVar7 = std::__cxx11::string::compare((char *)dad);
        if (iVar7 == 0) {
          if (nodes.super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>.
              _M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)&nodes) {
            if (local_194 == 0) {
              d.path._M_dataplus._M_p = (pointer)&d.path.field_2;
              d.path._M_string_length = 0;
              d.path.field_2._M_allocated_capacity =
                   d.path.field_2._M_allocated_capacity & 0xffffffffffffff00;
              d._48_8_ = d._48_8_ & 0xffffffff00000000;
              d.channels.
              super__List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>.
              _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&d.channels;
              d.pivotPos.z = 0.0;
              d.isPivotSet = false;
              d.channels.
              super__List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>.
              _M_impl._M_node._M_size = 0;
              d.pivotPos._0_5_ = 0;
              d.pivotPos.y._1_3_ = 0;
              d.lightColor.r = 1.0;
              d.lightColor.g = 1.0;
              d.lightColor.b = 1.0;
              d.lightIntensity = 1.0;
              d.lightType = 0;
              d.lightFalloffType = 0;
              d.lightConeAngle = 45.0;
              d.lightEdgeAngle = 0.0;
              d.children.
              super__List_base<Assimp::LWS::NodeDesc_*,_std::allocator<Assimp::LWS::NodeDesc_*>_>.
              _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&d.children;
              d.children.
              super__List_base<Assimp::LWS::NodeDesc_*,_std::allocator<Assimp::LWS::NodeDesc_*>_>.
              _M_impl._M_node._M_size._0_4_ = 0;
              d.parent_resolved = (NodeDesc *)0x0;
              d._4_4_ = d._4_4_;
              d.type = OBJECT;
              d.name = (char *)flipper.super_BaseProcess._vptr_BaseProcess;
              d._40_8_ = (ulong)uVar9 << 0x20;
              d.channels.
              super__List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>.
              _M_impl._M_node.super__List_node_base._M_prev =
                   d.channels.
                   super__List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>.
                   _M_impl._M_node.super__List_node_base._M_next;
              d.children.
              super__List_base<Assimp::LWS::NodeDesc_*,_std::allocator<Assimp::LWS::NodeDesc_*>_>.
              _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)plVar2;
              p_Var14 = std::__cxx11::
                        list<Assimp::LWS::NodeDesc,std::allocator<Assimp::LWS::NodeDesc>>::
                        _M_create_node<Assimp::LWS::NodeDesc_const&>
                                  ((list<Assimp::LWS::NodeDesc,std::allocator<Assimp::LWS::NodeDesc>>
                                    *)&nodes,&d);
              std::__detail::_List_node_base::_M_hook(&p_Var14->super__List_node_base);
              nodes.super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>.
              _M_impl._M_node._M_size =
                   nodes.
                   super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>.
                   _M_impl._M_node._M_size + 1;
              p_Var31 = d.children.
                        super__List_base<Assimp::LWS::NodeDesc_*,_std::allocator<Assimp::LWS::NodeDesc_*>_>
                        ._M_impl._M_node.super__List_node_base._M_next;
              while (p_Var31 != (_List_node_base *)plVar2) {
                p_Var12 = p_Var31->_M_next;
                operator_delete(p_Var31);
                p_Var31 = p_Var12;
              }
              std::__cxx11::
              _List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>::_M_clear
                        (&d.channels.
                          super__List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>
                        );
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)d.path._M_dataplus._M_p != &d.path.field_2) {
                operator_delete(d.path._M_dataplus._M_p);
              }
              uVar9 = uVar9 + 1;
            }
            pLVar13 = DefaultLogger::get();
            Logger::error(pLVar13,"LWS: Unexpected keyword: \'Channel\'");
          }
          d.type = 0;
          d._4_4_ = 0x10;
          d.path._M_dataplus._M_p = (pointer)0x100000001;
          d.path.field_2._8_8_ = 0;
          d.id = 0;
          d.number = 0;
          d.path._M_string_length = 0;
          d.path.field_2._M_allocated_capacity = 0;
          d.parent = 0;
          d._52_4_ = 0;
          std::__cxx11::list<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>::
          _M_insert<Assimp::LWO::Envelope>
                    ((list<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_> *)
                     (nodes.
                      super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                      ._M_impl._M_node.super__List_node_base._M_prev + 5),
                     (iterator)
                     (nodes.
                      super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                      ._M_impl._M_node.super__List_node_base._M_prev + 5),(Envelope *)&d);
          if (d.path._M_string_length != 0) {
            operator_delete((void *)d.path._M_string_length);
          }
          p_Var31 = nodes.
                    super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>.
                    _M_impl._M_node.super__List_node_base._M_prev[5]._M_prev;
          cVar23 = *(char *)flipper.super_BaseProcess._vptr_BaseProcess;
          iVar7 = 0;
          pPVar26 = (PropertyMap *)flipper.super_BaseProcess._vptr_BaseProcess;
          if (0xf5 < (byte)(cVar23 - 0x3aU)) {
            pPVar26 = (PropertyMap *)((long)flipper.super_BaseProcess._vptr_BaseProcess + 1);
            iVar7 = 0;
            do {
              iVar7 = (uint)(byte)(cVar23 - 0x30) + iVar7 * 10;
              cVar23 = *(char *)pPVar26;
              pPVar26 = (PropertyMap *)((long)pPVar26 + 1);
            } while (0xf5 < (byte)(cVar23 - 0x3aU));
          }
          *(int *)&p_Var31[1]._M_next = iVar7;
          *(int *)((long)&p_Var31[1]._M_next + 4) = iVar7 + 1;
        }
        else {
          pLVar33 = dad;
          iVar7 = std::__cxx11::string::compare((char *)dad);
          if (iVar7 == 0) {
            if ((nodes.
                 super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>.
                 _M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)&nodes) ||
               (pPVar26 = (PropertyMap *)
                          (nodes.
                           super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                           ._M_impl._M_node.super__List_node_base._M_prev + 5),
               (PropertyMap *)
               nodes.super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
               ._M_impl._M_node.super__List_node_base._M_prev[5]._M_next == pPVar26)) {
              pLVar13 = DefaultLogger::get();
              pcVar32 = "LWS: Unexpected keyword: \'Envelope\'";
              goto LAB_0044d40c;
            }
            ReadEnvelope(pLVar33,(Element *)dad,
                         (Envelope *)
                         (nodes.
                          super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                          ._M_impl._M_node.super__List_node_base._M_prev[5]._M_prev + 1));
          }
          else if ((uVar30 < 3) &&
                  (((pLVar33 = dad, iVar7 = std::__cxx11::string::compare((char *)dad), iVar7 == 0
                    || (pLVar33 = dad, iVar7 = std::__cxx11::string::compare((char *)dad),
                       iVar7 == 0)) ||
                   (pLVar33 = dad, iVar7 = std::__cxx11::string::compare((char *)dad), iVar7 == 0)))
                  ) {
            if (nodes.
                super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>.
                _M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)&nodes) {
              pLVar13 = DefaultLogger::get();
              pcVar32 = "LWS: Unexpected keyword: \'<Light|Object|Camera>Motion\'";
              goto LAB_0044d40c;
            }
            d._0_8_ = &root.children;
            pPVar26 = (PropertyMap *)
                      (nodes.
                       super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                       ._M_impl._M_node.super__List_node_base._M_prev + 1);
            ReadEnvelope_Old(pLVar33,&it,(const_iterator *)&d,(NodeDesc *)pPVar26,(uint)in_R8);
          }
          else if ((uVar30 == 2) &&
                  (pLVar33 = dad, iVar7 = std::__cxx11::string::compare((char *)dad), iVar7 == 0)) {
            if (nodes.
                super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>.
                _M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)&nodes) {
              pLVar13 = DefaultLogger::get();
              pcVar32 = "LWS: Unexpected keyword: \'Pre/PostBehavior\'";
              goto LAB_0044d40c;
            }
            for (pPVar26 = (PropertyMap *)
                           nodes.
                           super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                           ._M_impl._M_node.super__List_node_base._M_prev[5]._M_next;
                pPVar26 !=
                (PropertyMap *)
                (nodes.
                 super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>.
                 _M_impl._M_node.super__List_node_base._M_prev + 5);
                pPVar26 = *(PropertyMap **)&(pPVar26->ints)._M_t._M_impl) {
              cVar23 = *(char *)flipper.super_BaseProcess._vptr_BaseProcess;
              uVar34 = (undefined7)((ulong)pLVar33 >> 8);
              iVar7 = 0;
              if (0xf5 < (byte)(cVar23 - 0x3aU)) {
                iVar7 = 0;
                do {
                  iVar7 = (uint)(byte)(cVar23 - 0x30) + iVar7 * 10;
                  cVar23 = *(char *)((long)flipper.super_BaseProcess._vptr_BaseProcess + 1);
                  uVar34 = 0;
                  flipper.super_BaseProcess._vptr_BaseProcess =
                       (_func_int **)((long)flipper.super_BaseProcess._vptr_BaseProcess + 1);
                } while (0xf5 < (byte)(cVar23 - 0x3aU));
              }
              *(int *)&(pPVar26->ints)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = iVar7;
              for (; (*(char *)flipper.super_BaseProcess._vptr_BaseProcess == ' ' ||
                     (*(char *)flipper.super_BaseProcess._vptr_BaseProcess == '\t'));
                  flipper.super_BaseProcess._vptr_BaseProcess =
                       (_func_int **)((long)flipper.super_BaseProcess._vptr_BaseProcess + 1)) {
              }
              pLVar33 = (LWSImporter *)
                        CONCAT71(uVar34,*(char *)flipper.super_BaseProcess._vptr_BaseProcess);
              uVar10 = (int)pLVar33 - 0x3a;
              iVar7 = 0;
              if (0xf5 < (byte)uVar10) {
                iVar7 = 0;
                do {
                  iVar7 = (uint)(byte)((char)pLVar33 - 0x30) + iVar7 * 10;
                  pbVar1 = (byte *)((long)flipper.super_BaseProcess._vptr_BaseProcess + 1);
                  pLVar33 = (LWSImporter *)(ulong)*pbVar1;
                  flipper.super_BaseProcess._vptr_BaseProcess =
                       (_func_int **)((long)flipper.super_BaseProcess._vptr_BaseProcess + 1);
                  uVar10 = *pbVar1 - 0x3a;
                } while (0xf5 < (byte)uVar10);
              }
              in_R8 = (ulong)uVar10;
              *(int *)((long)&(pPVar26->ints)._M_t._M_impl.super__Rb_tree_header._M_header._M_left +
                      4) = iVar7;
              for (; (*(char *)flipper.super_BaseProcess._vptr_BaseProcess == ' ' ||
                     (*(char *)flipper.super_BaseProcess._vptr_BaseProcess == '\t'));
                  flipper.super_BaseProcess._vptr_BaseProcess =
                       (_func_int **)((long)flipper.super_BaseProcess._vptr_BaseProcess + 1)) {
              }
            }
          }
          else {
            iVar7 = std::__cxx11::string::compare((char *)dad);
            if (iVar7 == 0) {
              if (nodes.
                  super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>.
                  _M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)&nodes) {
                pLVar13 = DefaultLogger::get();
                pcVar32 = "LWS: Unexpected keyword: \'ParentItem\'";
                goto LAB_0044d40c;
              }
              uVar10 = strtoul16((char *)flipper.super_BaseProcess._vptr_BaseProcess,
                                 (char **)&flipper);
              *(uint *)&nodes.
                        super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                        ._M_impl._M_node.super__List_node_base._M_prev[4]._M_next = uVar10;
              pPVar26 = (PropertyMap *)
                        nodes.
                        super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                        ._M_impl._M_node.super__List_node_base._M_prev;
            }
            else if ((uVar30 < 3) &&
                    (iVar7 = std::__cxx11::string::compare((char *)dad), iVar7 == 0)) {
              if (nodes.
                  super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>.
                  _M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)&nodes) {
                pLVar13 = DefaultLogger::get();
                pcVar32 = "LWS: Unexpected keyword: \'ParentObject\'";
                goto LAB_0044d40c;
              }
              cVar23 = *(char *)flipper.super_BaseProcess._vptr_BaseProcess;
              pPVar26 = (PropertyMap *)0x10000000;
              if (0xf5 < (byte)(cVar23 - 0x3aU)) {
                uVar10 = 0;
                do {
                  uVar10 = (uint)(byte)(cVar23 - 0x30) + uVar10 * 10;
                  cVar23 = *(char *)((long)flipper.super_BaseProcess._vptr_BaseProcess + 1);
                  flipper.super_BaseProcess._vptr_BaseProcess =
                       (_func_int **)((long)flipper.super_BaseProcess._vptr_BaseProcess + 1);
                } while (0xf5 < (byte)(cVar23 - 0x3aU));
                pPVar26 = (PropertyMap *)(ulong)(uVar10 | 0x10000000);
              }
              *(int *)&nodes.
                       super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                       ._M_impl._M_node.super__List_node_base._M_prev[4]._M_next = (int)pPVar26;
            }
            else {
              iVar7 = std::__cxx11::string::compare((char *)dad);
              if (iVar7 == 0) {
                d.path._M_dataplus._M_p = (pointer)&d.path.field_2;
                d.path._M_string_length = 0;
                d.path.field_2._M_allocated_capacity =
                     d.path.field_2._M_allocated_capacity & 0xffffffffffffff00;
                d.id = 0;
                d.number = 0;
                d._48_8_ = d._48_8_ & 0xffffffff00000000;
                d.name = "";
                pPVar26 = (PropertyMap *)&d.channels;
                d.pivotPos.z = 0.0;
                d.isPivotSet = false;
                d.channels.
                super__List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>.
                _M_impl._M_node._M_size = 0;
                d.pivotPos._0_5_ = 0;
                d.pivotPos.y._1_3_ = 0;
                d.lightColor.r = 1.0;
                d.lightColor.g = 1.0;
                d.lightColor.b = 1.0;
                d.lightIntensity = 1.0;
                d.lightType = 0;
                d.lightFalloffType = 0;
                d.lightConeAngle = 45.0;
                d.lightEdgeAngle = 0.0;
                d.children.
                super__List_base<Assimp::LWS::NodeDesc_*,_std::allocator<Assimp::LWS::NodeDesc_*>_>.
                _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&d.children;
                d.children.
                super__List_base<Assimp::LWS::NodeDesc_*,_std::allocator<Assimp::LWS::NodeDesc_*>_>.
                _M_impl._M_node._M_size._0_4_ = 0;
                d.parent_resolved = (NodeDesc *)0x0;
                d._4_4_ = d._4_4_;
                d.type = CAMERA;
                d.channels.
                super__List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>.
                _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)pPVar26;
                d.channels.
                super__List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>.
                _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)pPVar26;
                if (uVar30 < 4) {
                  uVar10 = (uint)local_188;
                  pPVar26 = (PropertyMap *)(ulong)(uVar10 + 1);
                  d.children.
                  super__List_base<Assimp::LWS::NodeDesc_*,_std::allocator<Assimp::LWS::NodeDesc_*>_>
                  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)plVar2;
                  local_188 = pPVar26;
                }
                else {
                  d.children.
                  super__List_base<Assimp::LWS::NodeDesc_*,_std::allocator<Assimp::LWS::NodeDesc_*>_>
                  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)plVar2;
                  uVar10 = strtoul16((char *)flipper.super_BaseProcess._vptr_BaseProcess,
                                     (char **)&flipper);
                  uVar10 = uVar10 & 0xfffffff;
                }
                d.number = uVar10;
                std::__cxx11::list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>::
                push_back(&nodes,&d);
                local_2ac = local_2ac + 1;
LAB_0044d3e5:
                LWS::NodeDesc::~NodeDesc(&d);
              }
              else {
                iVar7 = std::__cxx11::string::compare((char *)dad);
                if (iVar7 == 0) {
                  if ((nodes.
                       super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                       ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&nodes)
                     && (*(int *)&nodes.
                                  super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                  ._M_impl._M_node.super__List_node_base._M_prev[1]._M_next == 3)) {
LAB_0044d397:
                    nodes.
                    super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>.
                    _M_impl._M_node.super__List_node_base._M_prev[4]._M_prev =
                         (_List_node_base *)flipper.super_BaseProcess._vptr_BaseProcess;
                    pPVar26 = (PropertyMap *)flipper.super_BaseProcess._vptr_BaseProcess;
                    goto LAB_0044cd57;
                  }
                  pLVar13 = DefaultLogger::get();
                  pcVar32 = "LWS: Unexpected keyword: \'CameraName\'";
                }
                else {
                  iVar7 = std::__cxx11::string::compare((char *)dad);
                  if (iVar7 == 0) {
                    d.path._M_dataplus._M_p = (pointer)&d.path.field_2;
                    d.path._M_string_length = 0;
                    d.path.field_2._M_allocated_capacity =
                         d.path.field_2._M_allocated_capacity & 0xffffffffffffff00;
                    d.id = 0;
                    d.number = 0;
                    d._48_8_ = d._48_8_ & 0xffffffff00000000;
                    d.name = "";
                    pPVar26 = (PropertyMap *)&d.channels;
                    d.pivotPos.z = 0.0;
                    d.isPivotSet = false;
                    d.channels.
                    super__List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>.
                    _M_impl._M_node._M_size = 0;
                    d.pivotPos._0_5_ = 0;
                    d.pivotPos.y._1_3_ = 0;
                    d.lightColor.r = 1.0;
                    d.lightColor.g = 1.0;
                    d.lightColor.b = 1.0;
                    d.lightIntensity = 1.0;
                    d.lightType = 0;
                    d.lightFalloffType = 0;
                    d.lightConeAngle = 45.0;
                    d.lightEdgeAngle = 0.0;
                    d.children.
                    super__List_base<Assimp::LWS::NodeDesc_*,_std::allocator<Assimp::LWS::NodeDesc_*>_>
                    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&d.children;
                    d.children.
                    super__List_base<Assimp::LWS::NodeDesc_*,_std::allocator<Assimp::LWS::NodeDesc_*>_>
                    ._M_impl._M_node._M_size._0_4_ = 0;
                    d.parent_resolved = (NodeDesc *)0x0;
                    d._4_4_ = d._4_4_;
                    d.type = LIGHT;
                    d.channels.
                    super__List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>.
                    _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)pPVar26;
                    d.channels.
                    super__List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>.
                    _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)pPVar26;
                    if (uVar30 < 4) {
                      uVar10 = (uint)local_190;
                      pPVar26 = (PropertyMap *)(ulong)(uVar10 + 1);
                      d.children.
                      super__List_base<Assimp::LWS::NodeDesc_*,_std::allocator<Assimp::LWS::NodeDesc_*>_>
                      ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)plVar2;
                      local_190 = pPVar26;
                    }
                    else {
                      d.children.
                      super__List_base<Assimp::LWS::NodeDesc_*,_std::allocator<Assimp::LWS::NodeDesc_*>_>
                      ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)plVar2;
                      uVar10 = strtoul16((char *)flipper.super_BaseProcess._vptr_BaseProcess,
                                         (char **)&flipper);
                      uVar10 = uVar10 & 0xfffffff;
                    }
                    d.number = uVar10;
                    std::__cxx11::
                    list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>::push_back
                              (&nodes,&d);
                    local_1dc = local_1dc + 1;
                    goto LAB_0044d3e5;
                  }
                  iVar7 = std::__cxx11::string::compare((char *)dad);
                  if (iVar7 != 0) {
                    iVar7 = std::__cxx11::string::compare((char *)dad);
                    if ((iVar7 == 0) ||
                       (iVar7 = std::__cxx11::string::compare((char *)dad), iVar7 == 0)) {
                      if ((nodes.
                           super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                           ._M_impl._M_node.super__List_node_base._M_next ==
                           (_List_node_base *)&nodes) ||
                         (*(int *)&nodes.
                                   super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                   ._M_impl._M_node.super__List_node_base._M_prev[1]._M_next != 2))
                      {
                        pLVar13 = DefaultLogger::get();
                        pcVar32 = "LWS: Unexpected keyword: \'LightIntensity\'";
                        goto LAB_0044d40c;
                      }
                      fast_atoreal_move<float>
                                ((Assimp *)flipper.super_BaseProcess._vptr_BaseProcess,
                                 (char *)((long)&nodes.
                                                 super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                                 ._M_impl._M_node.super__List_node_base._M_prev[8].
                                                 _M_next + 4),(float *)0x1,SUB81(pPVar26,0));
                    }
                    else {
                      iVar7 = std::__cxx11::string::compare((char *)dad);
                      if (iVar7 == 0) {
                        if ((nodes.
                             super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                             ._M_impl._M_node.super__List_node_base._M_next ==
                             (_List_node_base *)&nodes) ||
                           (*(int *)&nodes.
                                     super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                     ._M_impl._M_node.super__List_node_base._M_prev[1]._M_next != 2)
                           ) {
                          pLVar13 = DefaultLogger::get();
                          pcVar32 = "LWS: Unexpected keyword: \'LightType\'";
                          goto LAB_0044d40c;
                        }
                        cVar23 = *(char *)flipper.super_BaseProcess._vptr_BaseProcess;
                        iVar7 = 0;
                        pPVar26 = (PropertyMap *)flipper.super_BaseProcess._vptr_BaseProcess;
                        if (0xf5 < (byte)(cVar23 - 0x3aU)) {
                          pPVar26 = (PropertyMap *)
                                    ((long)flipper.super_BaseProcess._vptr_BaseProcess + 1);
                          iVar7 = 0;
                          do {
                            iVar7 = (uint)(byte)(cVar23 - 0x30) + iVar7 * 10;
                            cVar23 = *(char *)pPVar26;
                            pPVar26 = (PropertyMap *)((long)pPVar26 + 1);
                          } while (0xf5 < (byte)(cVar23 - 0x3aU));
                        }
                        *(int *)&nodes.
                                 super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                 ._M_impl._M_node.super__List_node_base._M_prev[8]._M_prev = iVar7;
                      }
                      else {
                        iVar7 = std::__cxx11::string::compare((char *)dad);
                        if (iVar7 == 0) {
                          if ((nodes.
                               super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                               ._M_impl._M_node.super__List_node_base._M_next ==
                               (_List_node_base *)&nodes) ||
                             (*(int *)&nodes.
                                       super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                       ._M_impl._M_node.super__List_node_base._M_prev[1]._M_next !=
                              2)) {
                            pLVar13 = DefaultLogger::get();
                            pcVar32 = "LWS: Unexpected keyword: \'LightFalloffType\'";
                            goto LAB_0044d40c;
                          }
                          cVar23 = *(char *)flipper.super_BaseProcess._vptr_BaseProcess;
                          iVar7 = 0;
                          pPVar26 = (PropertyMap *)flipper.super_BaseProcess._vptr_BaseProcess;
                          if (0xf5 < (byte)(cVar23 - 0x3aU)) {
                            pPVar26 = (PropertyMap *)
                                      ((long)flipper.super_BaseProcess._vptr_BaseProcess + 1);
                            iVar7 = 0;
                            do {
                              iVar7 = (uint)(byte)(cVar23 - 0x30) + iVar7 * 10;
                              cVar23 = *(char *)pPVar26;
                              pPVar26 = (PropertyMap *)((long)pPVar26 + 1);
                            } while (0xf5 < (byte)(cVar23 - 0x3aU));
                          }
                          *(int *)((long)&nodes.
                                          super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                          ._M_impl._M_node.super__List_node_base._M_prev[8]._M_prev
                                  + 4) = iVar7;
                        }
                        else {
                          iVar7 = std::__cxx11::string::compare((char *)dad);
                          if (iVar7 == 0) {
                            if ((nodes.
                                 super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                 ._M_impl._M_node.super__List_node_base._M_next ==
                                 (_List_node_base *)&nodes) ||
                               (*(int *)&nodes.
                                         super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                         ._M_impl._M_node.super__List_node_base._M_prev[1]._M_next
                                != 2)) {
                              pLVar13 = DefaultLogger::get();
                              pcVar32 = "LWS: Unexpected keyword: \'LightConeAngle\'";
                              goto LAB_0044d40c;
                            }
                            d._0_8_ = d._0_8_ & 0xffffffff00000000;
                            fast_atoreal_move<float>
                                      ((Assimp *)flipper.super_BaseProcess._vptr_BaseProcess,
                                       (char *)&d,(float *)0x1,SUB81(pPVar26,0));
                            *(anon_enum_32 *)
                             &nodes.
                              super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                              ._M_impl._M_node.super__List_node_base._M_prev[9]._M_next = d.type;
                          }
                          else {
                            iVar7 = std::__cxx11::string::compare((char *)dad);
                            if (iVar7 == 0) {
                              if ((nodes.
                                   super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                   ._M_impl._M_node.super__List_node_base._M_next ==
                                   (_List_node_base *)&nodes) ||
                                 (*(int *)&nodes.
                                           super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                           ._M_impl._M_node.super__List_node_base._M_prev[1]._M_next
                                  != 2)) {
                                pLVar13 = DefaultLogger::get();
                                pcVar32 = "LWS: Unexpected keyword: \'LightEdgeAngle\'";
                                goto LAB_0044d40c;
                              }
                              d._0_8_ = d._0_8_ & 0xffffffff00000000;
                              fast_atoreal_move<float>
                                        ((Assimp *)flipper.super_BaseProcess._vptr_BaseProcess,
                                         (char *)&d,(float *)0x1,SUB81(pPVar26,0));
                              *(anon_enum_32 *)
                               ((long)&nodes.
                                       super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                       ._M_impl._M_node.super__List_node_base._M_prev[9]._M_next + 4
                               ) = d.type;
                            }
                            else {
                              iVar7 = std::__cxx11::string::compare((char *)dad);
                              if (iVar7 == 0) {
                                if ((nodes.
                                     super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                     ._M_impl._M_node.super__List_node_base._M_next ==
                                     (_List_node_base *)&nodes) ||
                                   (*(int *)&nodes.
                                             super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                             ._M_impl._M_node.super__List_node_base._M_prev[1].
                                             _M_next != 2)) {
                                  pLVar13 = DefaultLogger::get();
                                  pcVar32 = "LWS: Unexpected keyword: \'LightColor\'";
                                  goto LAB_0044d40c;
                                }
                                for (flipper.super_BaseProcess._vptr_BaseProcess =
                                          (_func_int **)
                                          fast_atoreal_move<float>
                                                    ((Assimp *)
                                                     flipper.super_BaseProcess._vptr_BaseProcess,
                                                     (char *)&nodes.
                                                  super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                                  ._M_impl._M_node.super__List_node_base._M_prev[7].
                                                  _M_prev,(float *)0x1,SUB81(pPVar26,0));
                                    (AVar3 = *(Assimp *)flipper.super_BaseProcess._vptr_BaseProcess,
                                    AVar3 == (Assimp)0x20 || (AVar3 == (Assimp)0x9));
                                    flipper.super_BaseProcess._vptr_BaseProcess =
                                         (_func_int **)
                                         ((long)flipper.super_BaseProcess._vptr_BaseProcess + 1)) {
                                }
                                flipper.super_BaseProcess._vptr_BaseProcess =
                                     (_func_int **)
                                     fast_atoreal_move<float>
                                               ((Assimp *)
                                                flipper.super_BaseProcess._vptr_BaseProcess,
                                                (char *)((long)&nodes.
                                                  super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                                  ._M_impl._M_node.super__List_node_base._M_prev[7].
                                                  _M_prev + 4),(float *)0x1,(bool)AVar3);
                                while( true ) {
                                  AVar3 = *(Assimp *)flipper.super_BaseProcess._vptr_BaseProcess;
                                  pPVar26 = (PropertyMap *)(ulong)(byte)AVar3;
                                  if ((AVar3 != (Assimp)0x20) && (AVar3 != (Assimp)0x9)) break;
                                  flipper.super_BaseProcess._vptr_BaseProcess =
                                       (_func_int **)
                                       ((long)flipper.super_BaseProcess._vptr_BaseProcess + 1);
                                }
                                flipper.super_BaseProcess._vptr_BaseProcess =
                                     (_func_int **)
                                     fast_atoreal_move<float>
                                               ((Assimp *)
                                                flipper.super_BaseProcess._vptr_BaseProcess,
                                                (char *)(nodes.
                                                  super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                                  ._M_impl._M_node.super__List_node_base._M_prev + 8
                                                  ),(float *)0x1,(bool)AVar3);
                              }
                              else {
                                iVar7 = std::__cxx11::string::compare((char *)dad);
                                if ((iVar7 == 0) ||
                                   (iVar7 = std::__cxx11::string::compare((char *)dad), iVar7 == 0))
                                {
                                  if (nodes.
                                      super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                      ._M_impl._M_node.super__List_node_base._M_next ==
                                      (_List_node_base *)&nodes) {
                                    pLVar13 = DefaultLogger::get();
                                    pcVar32 = "LWS: Unexpected keyword: \'PivotPosition\'";
                                    goto LAB_0044d40c;
                                  }
                                  for (flipper.super_BaseProcess._vptr_BaseProcess =
                                            (_func_int **)
                                            fast_atoreal_move<float>
                                                      ((Assimp *)
                                                       flipper.super_BaseProcess._vptr_BaseProcess,
                                                       (char *)&nodes.
                                                  super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                                  ._M_impl._M_node.super__List_node_base._M_prev[6].
                                                  _M_prev,(float *)0x1,SUB81(pPVar26,0));
                                      (AVar3 = *(Assimp *)
                                                flipper.super_BaseProcess._vptr_BaseProcess,
                                      AVar3 == (Assimp)0x20 || (AVar3 == (Assimp)0x9));
                                      flipper.super_BaseProcess._vptr_BaseProcess =
                                           (_func_int **)
                                           ((long)flipper.super_BaseProcess._vptr_BaseProcess + 1))
                                  {
                                  }
                                  flipper.super_BaseProcess._vptr_BaseProcess =
                                       (_func_int **)
                                       fast_atoreal_move<float>
                                                 ((Assimp *)
                                                  flipper.super_BaseProcess._vptr_BaseProcess,
                                                  (char *)((long)&nodes.
                                                  super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                                  ._M_impl._M_node.super__List_node_base._M_prev[6].
                                                  _M_prev + 4),(float *)0x1,(bool)AVar3);
                                  while( true ) {
                                    AVar3 = *(Assimp *)flipper.super_BaseProcess._vptr_BaseProcess;
                                    pPVar26 = (PropertyMap *)(ulong)(byte)AVar3;
                                    if ((AVar3 != (Assimp)0x20) && (AVar3 != (Assimp)0x9)) break;
                                    flipper.super_BaseProcess._vptr_BaseProcess =
                                         (_func_int **)
                                         ((long)flipper.super_BaseProcess._vptr_BaseProcess + 1);
                                  }
                                  flipper.super_BaseProcess._vptr_BaseProcess =
                                       (_func_int **)
                                       fast_atoreal_move<float>
                                                 ((Assimp *)
                                                  flipper.super_BaseProcess._vptr_BaseProcess,
                                                  (char *)(nodes.
                                                  super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                                  ._M_impl._M_node.super__List_node_base._M_prev + 7
                                                  ),(float *)0x1,(bool)AVar3);
                                  *(undefined1 *)
                                   ((long)&nodes.
                                           super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                           ._M_impl._M_node.super__List_node_base._M_prev[7]._M_next
                                   + 4) = 1;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                    goto LAB_0044cd57;
                  }
                  if ((nodes.
                       super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                       ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&nodes)
                     && (*(int *)&nodes.
                                  super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                  ._M_impl._M_node.super__List_node_base._M_prev[1]._M_next == 2))
                  goto LAB_0044d397;
                  pLVar13 = DefaultLogger::get();
                  pcVar32 = "LWS: Unexpected keyword: \'LightName\'";
                }
LAB_0044d40c:
                Logger::error(pLVar13,pcVar32);
              }
            }
          }
        }
      }
      goto LAB_0044cd57;
    }
    d.path._M_dataplus._M_p = (pointer)&d.path.field_2;
    d.path._M_string_length = 0;
    d.path.field_2._M_allocated_capacity = d.path.field_2._M_allocated_capacity & 0xffffffffffffff00
    ;
    d._48_8_ = d._48_8_ & 0xffffffff00000000;
    d.channels.super__List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>.
    _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&d.channels;
    d.pivotPos.z = 0.0;
    d.isPivotSet = false;
    d.channels.super__List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>.
    _M_impl._M_node._M_size = 0;
    d.pivotPos._0_5_ = 0;
    d.pivotPos.y._1_3_ = 0;
    d.lightColor.r = 1.0;
    d.lightColor.g = 1.0;
    d.lightColor.b = 1.0;
    d.lightIntensity = 1.0;
    d.lightType = 0;
    d.lightFalloffType = 0;
    d.lightConeAngle = 45.0;
    d.lightEdgeAngle = 0.0;
    d.children.super__List_base<Assimp::LWS::NodeDesc_*,_std::allocator<Assimp::LWS::NodeDesc_*>_>.
    _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&d.children;
    d.children.super__List_base<Assimp::LWS::NodeDesc_*,_std::allocator<Assimp::LWS::NodeDesc_*>_>.
    _M_impl._M_node._M_size._0_4_ = 0;
    d.parent_resolved = (NodeDesc *)0x0;
    d._4_4_ = d._4_4_;
    d.type = OBJECT;
    if (3 < uVar30) {
      uVar9 = 0;
      do {
        bVar28 = *(byte *)flipper.super_BaseProcess._vptr_BaseProcess;
        if ((byte)(bVar28 - 0x30) < 10) {
          uVar9 = uVar9 << 4 | (uint)(byte)(bVar28 - 0x30);
        }
        else {
          bVar29 = bVar28 + 0xbf;
          if ((5 < bVar29) && (bVar29 = bVar28 + 0x9f, 5 < bVar29)) goto LAB_0044cccb;
          uVar9 = uVar9 * 0x10 + (uint)bVar29 + 10;
        }
        flipper.super_BaseProcess._vptr_BaseProcess =
             (_func_int **)((long)flipper.super_BaseProcess._vptr_BaseProcess + 1);
      } while( true );
    }
    pPVar26 = (PropertyMap *)
              d.channels.
              super__List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>.
              _M_impl._M_node.super__List_node_base._M_next;
    uVar10 = uVar9 + 1;
    goto LAB_0044ccf4;
  }
  if ((this->first != 150392.0) || (NAN(this->first))) {
    pPVar26 = (PropertyMap *)(ulong)*(byte *)flipper.super_BaseProcess._vptr_BaseProcess;
    if ((byte)(*(byte *)flipper.super_BaseProcess._vptr_BaseProcess - 0x3a) < 0xf6) {
      dVar4 = -1.0;
    }
    else {
      uVar10 = 0;
      do {
        uVar10 = (uint)(byte)((char)pPVar26 - 0x30) + uVar10 * 10;
        pbVar1 = (byte *)((long)flipper.super_BaseProcess._vptr_BaseProcess + 1);
        pPVar26 = (PropertyMap *)(ulong)*pbVar1;
        flipper.super_BaseProcess._vptr_BaseProcess =
             (_func_int **)((long)flipper.super_BaseProcess._vptr_BaseProcess + 1);
      } while (0xf5 < (byte)(*pbVar1 - 0x3a));
      pPVar26 = (PropertyMap *)(ulong)uVar10;
      dVar4 = (double)(long)pPVar26 + -1.0;
    }
    this->first = dVar4;
  }
  goto LAB_0044cd57;
LAB_0044c924:
  uVar24 = uVar10 & 0xfffffff;
  uVar10 = uVar9;
LAB_0044c92f:
  local_130 = (ulong)uVar24 << 0x20;
  for (; (*(char *)flipper.super_BaseProcess._vptr_BaseProcess == ' ' ||
         (*(char *)flipper.super_BaseProcess._vptr_BaseProcess == '\t'));
      flipper.super_BaseProcess._vptr_BaseProcess =
           (_func_int **)((long)flipper.super_BaseProcess._vptr_BaseProcess + 1)) {
  }
  local_118._M_impl._M_node.super__List_node_base._M_prev =
       local_118._M_impl._M_node.super__List_node_base._M_next;
  local_d0[0]._M_prev = local_d0;
  std::__cxx11::string::string
            ((string *)&monster_cheat,(char *)flipper.super_BaseProcess._vptr_BaseProcess,
             (allocator *)&lights);
  FindLWOFile((string *)&anims,this,(string *)&monster_cheat);
  if ((ProgressHandler **)monster_cheat.super_BaseProcess._vptr_BaseProcess !=
      &monster_cheat.super_BaseProcess.progress) {
    operator_delete(monster_cheat.super_BaseProcess._vptr_BaseProcess);
  }
  std::__cxx11::string::_M_assign
            ((string *)
             &attach.
              super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>.
              _M_impl.super__Vector_impl_data._M_finish);
  uVar9 = BatchLoader::AddLoadRequest(&batch,(string *)&anims,0,pPVar26);
  local_130 = CONCAT44(local_130._4_4_,uVar9);
  p_Var14 = std::__cxx11::list<Assimp::LWS::NodeDesc,std::allocator<Assimp::LWS::NodeDesc>>::
            _M_create_node<Assimp::LWS::NodeDesc_const&>
                      ((list<Assimp::LWS::NodeDesc,std::allocator<Assimp::LWS::NodeDesc>> *)&nodes,
                       (NodeDesc *)&attach);
  std::__detail::_List_node_base::_M_hook(&p_Var14->super__List_node_base);
  nodes.super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>._M_impl.
  _M_node._M_size =
       nodes.super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>._M_impl
       ._M_node._M_size + 1;
  p_Var31 = local_d0[0]._M_next;
  if (anims.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)&anims.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
    operator_delete(anims.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
    p_Var31 = local_d0[0]._M_next;
  }
  while (p_Var31 != local_d0) {
    p_Var12 = p_Var31->_M_next;
    operator_delete(p_Var31);
    p_Var31 = p_Var12;
  }
  std::__cxx11::_List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>::_M_clear
            (&local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)attach.super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>.
         _M_impl.super__Vector_impl_data._M_finish != &local_140) {
    operator_delete(attach.
                    super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_aiMatrix4x4t<float>_>,_std::_Select1st<std::pair<const_unsigned_int,_aiMatrix4x4t<float>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_aiMatrix4x4t<float>_>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_aiMatrix4x4t<float>_>,_std::_Select1st<std::pair<const_unsigned_int,_aiMatrix4x4t<float>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_aiMatrix4x4t<float>_>_>_>
               *)&d.children.
                  super__List_base<Assimp::LWS::NodeDesc_*,_std::allocator<Assimp::LWS::NodeDesc_*>_>
                  ._M_impl._M_node.super__List_node_base._M_prev);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&d.pivotPos.z);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_float>,_std::_Select1st<std::pair<const_unsigned_int,_float>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_float>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_float>,_std::_Select1st<std::pair<const_unsigned_int,_float>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_float>_>_>
               *)&d.parent);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_int>,_std::_Select1st<std::pair<const_unsigned_int,_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_int>,_std::_Select1st<std::pair<const_unsigned_int,_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
               *)&d);
  uVar9 = uVar10;
  goto LAB_0044cd57;
LAB_0044cba0:
  uVar9 = uVar9 & 0xfffffff;
  for (; (*(char *)flipper.super_BaseProcess._vptr_BaseProcess == ' ' ||
         (*(char *)flipper.super_BaseProcess._vptr_BaseProcess == '\t'));
      flipper.super_BaseProcess._vptr_BaseProcess =
           (_func_int **)((long)flipper.super_BaseProcess._vptr_BaseProcess + 1)) {
  }
LAB_0044cbc9:
  d._40_8_ = (ulong)uVar9 << 0x20;
  d.channels.super__List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>._M_impl
  ._M_node.super__List_node_base._M_prev =
       d.channels.super__List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>.
       _M_impl._M_node.super__List_node_base._M_next;
  d.children.super__List_base<Assimp::LWS::NodeDesc_*,_std::allocator<Assimp::LWS::NodeDesc_*>_>.
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)plVar2;
  std::__cxx11::string::string
            ((string *)&anims,(char *)flipper.super_BaseProcess._vptr_BaseProcess,
             (allocator *)&monster_cheat);
  FindLWOFile((string *)&attach,this,(string *)&anims);
  if (anims.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)&anims.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
    operator_delete(anims.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  pPVar26 = (PropertyMap *)0x0;
  uVar9 = BatchLoader::AddLoadRequest(&batch,(string *)&attach,0,(PropertyMap *)0x0);
  d.id = uVar9;
  std::__cxx11::string::_M_assign((string *)&d.path);
  p_Var14 = std::__cxx11::list<Assimp::LWS::NodeDesc,std::allocator<Assimp::LWS::NodeDesc>>::
            _M_create_node<Assimp::LWS::NodeDesc_const&>
                      ((list<Assimp::LWS::NodeDesc,std::allocator<Assimp::LWS::NodeDesc>> *)&nodes,
                       &d);
  std::__detail::_List_node_base::_M_hook(&p_Var14->super__List_node_base);
  nodes.super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>._M_impl.
  _M_node._M_size =
       nodes.super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>._M_impl
       ._M_node._M_size + 1;
  p_Var31 = d.children.
            super__List_base<Assimp::LWS::NodeDesc_*,_std::allocator<Assimp::LWS::NodeDesc_*>_>.
            _M_impl._M_node.super__List_node_base._M_next;
  if (attach.super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (pointer)&attach.
                super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
    operator_delete(attach.
                    super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start);
    p_Var31 = d.children.
              super__List_base<Assimp::LWS::NodeDesc_*,_std::allocator<Assimp::LWS::NodeDesc_*>_>.
              _M_impl._M_node.super__List_node_base._M_next;
  }
  while (p_Var31 != (_List_node_base *)plVar2) {
    p_Var12 = p_Var31->_M_next;
    operator_delete(p_Var31);
    p_Var31 = p_Var12;
  }
  std::__cxx11::_List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>::_M_clear
            (&d.channels.
              super__List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>);
  uVar9 = uVar10;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)d.path._M_dataplus._M_p == &d.path.field_2) goto LAB_0044cd57;
  goto LAB_0044cd52;
LAB_0044cccb:
  uVar9 = uVar9 & 0xfffffff;
  while( true ) {
    bVar28 = *(byte *)flipper.super_BaseProcess._vptr_BaseProcess;
    pPVar26 = (PropertyMap *)(ulong)bVar28;
    if ((bVar28 != 0x20) && (bVar28 != 9)) break;
    flipper.super_BaseProcess._vptr_BaseProcess =
         (_func_int **)((long)flipper.super_BaseProcess._vptr_BaseProcess + 1);
  }
LAB_0044ccf4:
  d._40_8_ = (ulong)uVar9 << 0x20;
  d.name = (char *)flipper.super_BaseProcess._vptr_BaseProcess;
  d.channels.super__List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>._M_impl
  ._M_node.super__List_node_base._M_prev =
       d.channels.super__List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>.
       _M_impl._M_node.super__List_node_base._M_next;
  d.children.super__List_base<Assimp::LWS::NodeDesc_*,_std::allocator<Assimp::LWS::NodeDesc_*>_>.
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)plVar2;
  p_Var14 = std::__cxx11::list<Assimp::LWS::NodeDesc,std::allocator<Assimp::LWS::NodeDesc>>::
            _M_create_node<Assimp::LWS::NodeDesc_const&>
                      ((list<Assimp::LWS::NodeDesc,std::allocator<Assimp::LWS::NodeDesc>> *)&nodes,
                       &d);
  std::__detail::_List_node_base::_M_hook(&p_Var14->super__List_node_base);
  nodes.super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>._M_impl.
  _M_node._M_size =
       nodes.super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>._M_impl
       ._M_node._M_size + 1;
  p_Var31 = d.children.
            super__List_base<Assimp::LWS::NodeDesc_*,_std::allocator<Assimp::LWS::NodeDesc_*>_>.
            _M_impl._M_node.super__List_node_base._M_next;
  while (p_Var31 != (_List_node_base *)plVar2) {
    p_Var12 = p_Var31->_M_next;
    operator_delete(p_Var31);
    p_Var31 = p_Var12;
  }
  std::__cxx11::_List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>::_M_clear
            (&d.channels.
              super__List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>);
  uVar9 = uVar10;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)d.path._M_dataplus._M_p == &d.path.field_2) goto LAB_0044cd57;
LAB_0044cd52:
  operator_delete(d.path._M_dataplus._M_p);
  uVar9 = uVar10;
LAB_0044cd57:
  it._M_node = (it._M_node)->_M_next;
  p_Var12 = nodes.super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>.
            _M_impl._M_node.super__List_node_base._M_next;
  p_Var31 = nodes.super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>.
            _M_impl._M_node.super__List_node_base._M_next;
  if (it._M_node == (_List_node_base *)&root.children) goto joined_r0x0044d6be;
  goto LAB_0044c1a0;
}

Assistant:

void LWSImporter::InternReadFile( const std::string& pFile, aiScene* pScene,
    IOSystem* pIOHandler)
{
    io = pIOHandler;
    std::unique_ptr<IOStream> file( pIOHandler->Open( pFile, "rb"));

    // Check whether we can read from the file
    if( file.get() == NULL) {
        throw DeadlyImportError( "Failed to open LWS file " + pFile + ".");
    }

    // Allocate storage and copy the contents of the file to a memory buffer
    std::vector< char > mBuffer;
    TextFileToBuffer(file.get(),mBuffer);

    // Parse the file structure
    LWS::Element root; const char* dummy = &mBuffer[0];
    root.Parse(dummy);

    // Construct a Batchimporter to read more files recursively
    BatchLoader batch(pIOHandler);
//  batch.SetBasePath(pFile);

    // Construct an array to receive the flat output graph
    std::list<LWS::NodeDesc> nodes;

    unsigned int cur_light = 0, cur_camera = 0, cur_object = 0;
    unsigned int num_light = 0, num_camera = 0, num_object = 0;

    // check magic identifier, 'LWSC'
    bool motion_file = false;
    std::list< LWS::Element >::const_iterator it = root.children.begin();

    if ((*it).tokens[0] == "LWMO")
        motion_file = true;

    if ((*it).tokens[0] != "LWSC" && !motion_file)
        throw DeadlyImportError("LWS: Not a LightWave scene, magic tag LWSC not found");

    // get file format version and print to log
    ++it;
    unsigned int version = strtoul10((*it).tokens[0].c_str());
    ASSIMP_LOG_INFO("LWS file format version is " + (*it).tokens[0]);
    first = 0.;
    last  = 60.;
    fps   = 25.; /* seems to be a good default frame rate */

    // Now read all elements in a very straghtforward manner
    for (; it != root.children.end(); ++it) {
        const char* c = (*it).tokens[1].c_str();

        // 'FirstFrame': begin of animation slice
        if ((*it).tokens[0] == "FirstFrame") {
            if (150392. != first           /* see SetupProperties() */)
                first = strtoul10(c,&c)-1.; /* we're zero-based */
        }

        // 'LastFrame': end of animation slice
        else if ((*it).tokens[0] == "LastFrame") {
            if (150392. != last      /* see SetupProperties() */)
                last = strtoul10(c,&c)-1.; /* we're zero-based */
        }

        // 'FramesPerSecond': frames per second
        else if ((*it).tokens[0] == "FramesPerSecond") {
            fps = strtoul10(c,&c);
        }

        // 'LoadObjectLayer': load a layer of a specific LWO file
        else if ((*it).tokens[0] == "LoadObjectLayer") {

            // get layer index
            const int layer = strtoul10(c,&c);

            // setup the layer to be loaded
            BatchLoader::PropertyMap props;
            SetGenericProperty(props.ints,AI_CONFIG_IMPORT_LWO_ONE_LAYER_ONLY,layer);

            // add node to list
            LWS::NodeDesc d;
            d.type = LWS::NodeDesc::OBJECT;
            if (version >= 4) { // handle LWSC 4 explicit ID
                SkipSpaces(&c);
                d.number = strtoul16(c,&c) & AI_LWS_MASK;
            }
            else d.number = cur_object++;

            // and add the file to the import list
            SkipSpaces(&c);
            std::string path = FindLWOFile( c );
            d.path = path;
            d.id = batch.AddLoadRequest(path,0,&props);

            nodes.push_back(d);
            num_object++;
        }
        // 'LoadObject': load a LWO file into the scenegraph
        else if ((*it).tokens[0] == "LoadObject") {

            // add node to list
            LWS::NodeDesc d;
            d.type = LWS::NodeDesc::OBJECT;

            if (version >= 4) { // handle LWSC 4 explicit ID
                d.number = strtoul16(c,&c) & AI_LWS_MASK;
                SkipSpaces(&c);
            }
            else d.number = cur_object++;
            std::string path = FindLWOFile( c );
            d.id = batch.AddLoadRequest(path,0,NULL);

            d.path = path;
            nodes.push_back(d);
            num_object++;
        }
        // 'AddNullObject': add a dummy node to the hierarchy
        else if ((*it).tokens[0] == "AddNullObject") {

            // add node to list
            LWS::NodeDesc d;
            d.type = LWS::NodeDesc::OBJECT;
            if (version >= 4) { // handle LWSC 4 explicit ID
                d.number = strtoul16(c,&c) & AI_LWS_MASK;
                SkipSpaces(&c);
            }
            else d.number = cur_object++;
            d.name = c;
            nodes.push_back(d);

            num_object++;
        }
        // 'NumChannels': Number of envelope channels assigned to last layer
        else if ((*it).tokens[0] == "NumChannels") {
            // ignore for now
        }
        // 'Channel': preceedes any envelope description
        else if ((*it).tokens[0] == "Channel") {
            if (nodes.empty()) {
                if (motion_file) {

                    // LightWave motion file. Add dummy node
                    LWS::NodeDesc d;
                    d.type = LWS::NodeDesc::OBJECT;
                    d.name = c;
                    d.number = cur_object++;
                    nodes.push_back(d);
                }
                ASSIMP_LOG_ERROR("LWS: Unexpected keyword: \'Channel\'");
            }

            // important: index of channel
            nodes.back().channels.push_back(LWO::Envelope());
            LWO::Envelope& env = nodes.back().channels.back();

            env.index = strtoul10(c);

            // currently we can just interpret the standard channels 0...9
            // (hack) assume that index-i yields the binary channel type from LWO
            env.type = (LWO::EnvelopeType)(env.index+1);

        }
        // 'Envelope': a single animation channel
        else if ((*it).tokens[0] == "Envelope") {
            if (nodes.empty() || nodes.back().channels.empty())
                ASSIMP_LOG_ERROR("LWS: Unexpected keyword: \'Envelope\'");
            else {
                ReadEnvelope((*it),nodes.back().channels.back());
            }
        }
        // 'ObjectMotion': animation information for older lightwave formats
        else if (version < 3  && ((*it).tokens[0] == "ObjectMotion" ||
            (*it).tokens[0] == "CameraMotion" ||
            (*it).tokens[0] == "LightMotion")) {

            if (nodes.empty())
                ASSIMP_LOG_ERROR("LWS: Unexpected keyword: \'<Light|Object|Camera>Motion\'");
            else {
                ReadEnvelope_Old(it,root.children.end(),nodes.back(),version);
            }
        }
        // 'Pre/PostBehavior': pre/post animation behaviour for LWSC 2
        else if (version == 2 && (*it).tokens[0] == "Pre/PostBehavior") {
            if (nodes.empty())
                ASSIMP_LOG_ERROR("LWS: Unexpected keyword: \'Pre/PostBehavior'");
            else {
                for (std::list<LWO::Envelope>::iterator it = nodes.back().channels.begin(); it != nodes.back().channels.end(); ++it) {
                    // two ints per envelope
                    LWO::Envelope& env = *it;
                    env.pre  = (LWO::PrePostBehaviour) strtoul10(c,&c); SkipSpaces(&c);
                    env.post = (LWO::PrePostBehaviour) strtoul10(c,&c); SkipSpaces(&c);
                }
            }
        }
        // 'ParentItem': specifies the parent of the current element
        else if ((*it).tokens[0] == "ParentItem") {
            if (nodes.empty())
                ASSIMP_LOG_ERROR("LWS: Unexpected keyword: \'ParentItem\'");

            else nodes.back().parent = strtoul16(c,&c);
        }
        // 'ParentObject': deprecated one for older formats
        else if (version < 3 && (*it).tokens[0] == "ParentObject") {
            if (nodes.empty())
                ASSIMP_LOG_ERROR("LWS: Unexpected keyword: \'ParentObject\'");

            else {
                nodes.back().parent = strtoul10(c,&c) | (1u << 28u);
            }
        }
        // 'AddCamera': add a camera to the scenegraph
        else if ((*it).tokens[0] == "AddCamera") {

            // add node to list
            LWS::NodeDesc d;
            d.type = LWS::NodeDesc::CAMERA;

            if (version >= 4) { // handle LWSC 4 explicit ID
                d.number = strtoul16(c,&c) & AI_LWS_MASK;
            }
            else d.number = cur_camera++;
            nodes.push_back(d);

            num_camera++;
        }
        // 'CameraName': set name of currently active camera
        else if ((*it).tokens[0] == "CameraName") {
            if (nodes.empty() || nodes.back().type != LWS::NodeDesc::CAMERA)
                ASSIMP_LOG_ERROR("LWS: Unexpected keyword: \'CameraName\'");

            else nodes.back().name = c;
        }
        // 'AddLight': add a light to the scenegraph
        else if ((*it).tokens[0] == "AddLight") {

            // add node to list
            LWS::NodeDesc d;
            d.type = LWS::NodeDesc::LIGHT;

            if (version >= 4) { // handle LWSC 4 explicit ID
                d.number = strtoul16(c,&c) & AI_LWS_MASK;
            }
            else d.number = cur_light++;
            nodes.push_back(d);

            num_light++;
        }
        // 'LightName': set name of currently active light
        else if ((*it).tokens[0] == "LightName") {
            if (nodes.empty() || nodes.back().type != LWS::NodeDesc::LIGHT)
                ASSIMP_LOG_ERROR("LWS: Unexpected keyword: \'LightName\'");

            else nodes.back().name = c;
        }
        // 'LightIntensity': set intensity of currently active light
        else if ((*it).tokens[0] == "LightIntensity" || (*it).tokens[0] == "LgtIntensity" ) {
            if (nodes.empty() || nodes.back().type != LWS::NodeDesc::LIGHT)
                ASSIMP_LOG_ERROR("LWS: Unexpected keyword: \'LightIntensity\'");

            else fast_atoreal_move<float>(c, nodes.back().lightIntensity );

        }
        // 'LightType': set type of currently active light
        else if ((*it).tokens[0] == "LightType") {
            if (nodes.empty() || nodes.back().type != LWS::NodeDesc::LIGHT)
                ASSIMP_LOG_ERROR("LWS: Unexpected keyword: \'LightType\'");

            else nodes.back().lightType = strtoul10(c);

        }
        // 'LightFalloffType': set falloff type of currently active light
        else if ((*it).tokens[0] == "LightFalloffType") {
            if (nodes.empty() || nodes.back().type != LWS::NodeDesc::LIGHT)
                ASSIMP_LOG_ERROR("LWS: Unexpected keyword: \'LightFalloffType\'");

            else nodes.back().lightFalloffType = strtoul10(c);

        }
        // 'LightConeAngle': set cone angle of currently active light
        else if ((*it).tokens[0] == "LightConeAngle") {
            if (nodes.empty() || nodes.back().type != LWS::NodeDesc::LIGHT)
                ASSIMP_LOG_ERROR("LWS: Unexpected keyword: \'LightConeAngle\'");

            else nodes.back().lightConeAngle = fast_atof(c);

        }
        // 'LightEdgeAngle': set area where we're smoothing from min to max intensity
        else if ((*it).tokens[0] == "LightEdgeAngle") {
            if (nodes.empty() || nodes.back().type != LWS::NodeDesc::LIGHT)
                ASSIMP_LOG_ERROR("LWS: Unexpected keyword: \'LightEdgeAngle\'");

            else nodes.back().lightEdgeAngle = fast_atof(c);

        }
        // 'LightColor': set color of currently active light
        else if ((*it).tokens[0] == "LightColor") {
            if (nodes.empty() || nodes.back().type != LWS::NodeDesc::LIGHT)
                ASSIMP_LOG_ERROR("LWS: Unexpected keyword: \'LightColor\'");

            else {
                c = fast_atoreal_move<float>(c, (float&) nodes.back().lightColor.r );
                SkipSpaces(&c);
                c = fast_atoreal_move<float>(c, (float&) nodes.back().lightColor.g );
                SkipSpaces(&c);
                c = fast_atoreal_move<float>(c, (float&) nodes.back().lightColor.b );
            }
        }

        // 'PivotPosition': position of local transformation origin
        else if ((*it).tokens[0] == "PivotPosition" || (*it).tokens[0] == "PivotPoint") {
            if (nodes.empty())
                ASSIMP_LOG_ERROR("LWS: Unexpected keyword: \'PivotPosition\'");
            else {
                c = fast_atoreal_move<float>(c, (float&) nodes.back().pivotPos.x );
                SkipSpaces(&c);
                c = fast_atoreal_move<float>(c, (float&) nodes.back().pivotPos.y );
                SkipSpaces(&c);
                c = fast_atoreal_move<float>(c, (float&) nodes.back().pivotPos.z );
                // Mark pivotPos as set
                nodes.back().isPivotSet = true;
            }
        }
    }

    // resolve parenting
    for (std::list<LWS::NodeDesc>::iterator it = nodes.begin(); it != nodes.end(); ++it) {

        // check whether there is another node which calls us a parent
        for (std::list<LWS::NodeDesc>::iterator dit = nodes.begin(); dit != nodes.end(); ++dit) {
            if (dit != it && *it == (*dit).parent) {
                if ((*dit).parent_resolved) {
                    // fixme: it's still possible to produce an overflow due to cross references ..
                    ASSIMP_LOG_ERROR("LWS: Found cross reference in scene-graph");
                    continue;
                }

                (*it).children.push_back(&*dit);
                (*dit).parent_resolved = &*it;
            }
        }
    }

    // find out how many nodes have no parent yet
    unsigned int no_parent = 0;
    for (std::list<LWS::NodeDesc>::iterator it = nodes.begin(); it != nodes.end(); ++it) {
        if (!(*it).parent_resolved)
            ++ no_parent;
    }
    if (!no_parent)
        throw DeadlyImportError("LWS: Unable to find scene root node");


    // Load all subsequent files
    batch.LoadAll();

    // and build the final output graph by attaching the loaded external
    // files to ourselves. first build a master graph
    aiScene* master = new aiScene();
    aiNode* nd = master->mRootNode = new aiNode();

    // allocate storage for cameras&lights
    if (num_camera) {
        master->mCameras = new aiCamera*[master->mNumCameras = num_camera];
    }
    aiCamera** cams = master->mCameras;
    if (num_light) {
        master->mLights = new aiLight*[master->mNumLights = num_light];
    }
    aiLight** lights = master->mLights;

    std::vector<AttachmentInfo> attach;
    std::vector<aiNodeAnim*> anims;

    nd->mName.Set("<LWSRoot>");
    nd->mChildren = new aiNode*[no_parent];
    for (std::list<LWS::NodeDesc>::iterator it = nodes.begin(); it != nodes.end(); ++it) {
        if (!(*it).parent_resolved) {
            aiNode* ro = nd->mChildren[ nd->mNumChildren++ ] = new aiNode();
            ro->mParent = nd;

            // ... and build the scene graph. If we encounter object nodes,
            // add then to our attachment table.
            BuildGraph(ro,*it, attach, batch, cams, lights, anims);
        }
    }

    // create a master animation channel for us
    if (anims.size()) {
        master->mAnimations = new aiAnimation*[master->mNumAnimations = 1];
        aiAnimation* anim = master->mAnimations[0] = new aiAnimation();
        anim->mName.Set("LWSMasterAnim");

        // LWS uses seconds as time units, but we convert to frames
        anim->mTicksPerSecond = fps;
        anim->mDuration = last-(first-1); /* fixme ... zero or one-based?*/

        anim->mChannels = new aiNodeAnim*[anim->mNumChannels = static_cast<unsigned int>(anims.size())];
        std::copy(anims.begin(),anims.end(),anim->mChannels);
    }

    // convert the master scene to RH
    MakeLeftHandedProcess monster_cheat;
    monster_cheat.Execute(master);

    // .. ccw
    FlipWindingOrderProcess flipper;
    flipper.Execute(master);

    // OK ... finally build the output graph
    SceneCombiner::MergeScenes(&pScene,master,attach,
        AI_INT_MERGE_SCENE_GEN_UNIQUE_NAMES    | (!configSpeedFlag ? (
        AI_INT_MERGE_SCENE_GEN_UNIQUE_NAMES_IF_NECESSARY | AI_INT_MERGE_SCENE_GEN_UNIQUE_MATNAMES) : 0));

    // Check flags
    if (!pScene->mNumMeshes || !pScene->mNumMaterials) {
        pScene->mFlags |= AI_SCENE_FLAGS_INCOMPLETE;

        if (pScene->mNumAnimations && !noSkeletonMesh) {
            // construct skeleton mesh
            SkeletonMeshBuilder builder(pScene);
        }
    }

}